

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial-3.cpp
# Opt level: O1

void readHandler(error_code *error,size_t bytes_transferred,socket_ptr *socket,array_ptr *readBuffer
                )

{
  element_type *peVar1;
  bool bVar2;
  ostream *this;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  error_category *peVar4;
  char *__function;
  error_code ec;
  shared_ptr<boost::array<char,_1024UL>_> *in_stack_ffffffffffffff68;
  transfer_all_t local_89;
  shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  local_88;
  element_type *local_78;
  shared_count local_70;
  mutable_buffers_1 local_68;
  bind_t<void,_void_(*)(const_boost::system::error_code_&,_unsigned_long,_boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_boost::shared_ptr<boost::array<char,_1024UL>_>),_boost::_bi::list4<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::array<char,_1024UL>_>_>_>_>
  local_58;
  element_type *local_30;
  
  if (error->failed_ != true) {
LAB_0012b6ea:
    if (readBuffer->px == (element_type *)0x0) {
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::array<char, 1024>>::operator->() const [T = boost::array<char, 1024>]"
                   );
    }
    std::ostream::write((char *)&std::cout,(long)readBuffer->px);
    if ((DAT_00144348 != (error_category *)0x8fafd21e25c5e09b) &&
       (DAT_00144348 != (error_category *)0xb2ab117a257edf0d)) {
      (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
                (&boost::asio::error::get_misc_category()::instance,2);
    }
    if (error->val_ == 2) {
      bVar2 = (error_category *)error->cat_->id_ != DAT_00144348;
      if (DAT_00144348 == (error_category *)0x0) {
        bVar2 = error->cat_ != (error_category *)&boost::asio::error::get_misc_category()::instance;
      }
      if (!bVar2) {
        return;
      }
    }
    peVar1 = socket->px;
    if (peVar1 == (element_type *)0x0) {
      __function = 
      "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp>>::operator*() const [T = boost::asio::basic_stream_socket<boost::asio::ip::tcp>]"
      ;
    }
    else {
      local_68.super_mutable_buffer.data_ = readBuffer->px;
      if ((element_type *)local_68.super_mutable_buffer.data_ != (element_type *)0x0) {
        local_68.super_mutable_buffer.size_ = 0x400;
        local_70.pi_ = (socket->pn).pi_;
        if (local_70.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_70.pi_)->use_count_ = (local_70.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_88.px = (element_type *)readBuffer->px;
        local_88.pn.pi_ = (readBuffer->pn).pi_;
        if (local_88.pn.pi_ != (sp_counted_base *)0x0) {
          LOCK();
          (local_88.pn.pi_)->use_count_ = (local_88.pn.pi_)->use_count_ + 1;
          UNLOCK();
        }
        local_78 = peVar1;
        boost::
        bind<void,boost::system::error_code_const&,unsigned_long,boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::array<char,1024ul>>,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,boost::shared_ptr<boost::array<char,1024ul>>>
                  (&local_58,(boost *)readHandler,boost::asio::placeholders::error,
                   boost::asio::placeholders::bytes_transferred,(_func_arg<2> *)&local_78,&local_88,
                   in_stack_ffffffffffffff68);
        local_30 = peVar1;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
        ::operator()((initiate_async_read_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                      *)&local_30,&local_58,&local_68,&local_89);
        boost::detail::shared_count::~shared_count
                  (&local_58.l_.
                    super_storage4<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::array<char,_1024UL>_>_>_>
                    .a4_.t_.pn);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   ((long)&local_58.l_.
                           super_storage4<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_boost::_bi::value<boost::shared_ptr<boost::array<char,_1024UL>_>_>_>
                           .
                           super_storage3<boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>_>
                           .a3_.t_ + 8));
        boost::detail::shared_count::~shared_count(&local_88.pn);
        boost::detail::shared_count::~shared_count(&local_70);
        return;
      }
      __function = 
      "typename boost::detail::sp_dereference<T>::type boost::shared_ptr<boost::array<char, 1024>>::operator*() const [T = boost::array<char, 1024>]"
      ;
    }
    __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d2,__function);
  }
  peVar4 = (error_category *)readBuffer;
  if ((DAT_00144348 != (error_category *)0x8fafd21e25c5e09b) &&
     (peVar4 = (error_category *)0xb2ab117a257edf0d,
     DAT_00144348 != (error_category *)0xb2ab117a257edf0d)) {
    (**(code **)(boost::asio::error::get_misc_category()::instance + 0x30))
              (&boost::asio::error::get_misc_category()::instance,2);
  }
  if (error->val_ == 2) {
    bVar2 = (error_category *)error->cat_->id_ != DAT_00144348;
    if (DAT_00144348 == (error_category *)0x0) {
      bVar2 = error->cat_ != (error_category *)&boost::asio::error::get_misc_category()::instance;
    }
    peVar4 = DAT_00144348;
    if (!bVar2) goto LAB_0012b6ea;
  }
  this = std::operator<<((ostream *)&std::cerr,"Read error: ");
  ec.cat_ = peVar4;
  ec._0_8_ = error->cat_;
  pbVar3 = boost::system::operator<<
                     ((system *)this,*(basic_ostream<char,_std::char_traits<char>_> **)error,ec);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar3);
  exit(5);
}

Assistant:

void readHandler(
    const boost::system::error_code&    error,
    size_t                              bytes_transferred,
    socket_ptr                          socket,
    array_ptr                           readBuffer
){
    if( error && error != boost::asio::error::eof ){
        cerr << "Read error: " << error << endl;
        exit( READ_FAILURE );
    }

    // We have received some data, so now we'll write it out.
    cout.write( readBuffer->data(), bytes_transferred );

    // If we haven't reached the end of file yet, trigger another asynchronous read just like the
    // one in the `writeHandler`.
    if( error != boost::asio::error::eof ){
        boost::asio::async_read(
            *socket,
            boost::asio::buffer( *readBuffer ),
            boost::bind(
                &readHandler,
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                socket,
                readBuffer
            )
        );
    }
}